

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

vector<double> * __thiscall
mat_lib::vector<double>::operator-=
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  size_t sVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  logic_error *this_00;
  size_t sVar5;
  
  sVar1 = this->max_size__;
  if (sVar1 == rhs->max_size__) {
    if (sVar1 != 0) {
      pdVar2 = (rhs->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = 0;
      do {
        pdVar3[sVar5] = pdVar3[sVar5] - pdVar2[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    __return_storage_ptr__->max_size__ = sVar1;
    std::vector<double,_std::allocator<double>_>::vector
              (&__return_storage_ptr__->container__,&this->container__);
    iVar4 = this->fractional_digits__;
    __return_storage_ptr__->format__ = this->format__;
    __return_storage_ptr__->fractional_digits__ = iVar4;
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad subtract operations");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t size() const {
          return max_size__;
      }